

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher-chachapoly.c
# Opt level: O0

int chachapoly_crypt(chachapoly_ctx *ctx,u_int seqnr,u_char *dest,u_char *src,u_int len,u_int aadlen
                    ,int do_encrypt)

{
  int iVar1;
  u_char *tag;
  uchar *ptr;
  u8 local_78 [4];
  int r;
  u_char poly_key [32];
  u_char expected_tag [16];
  u8 local_40 [8];
  u_char one [8];
  u_char seqbuf [8];
  u_int aadlen_local;
  u_int len_local;
  u_char *src_local;
  u_char *dest_local;
  u_int seqnr_local;
  chachapoly_ctx *ctx_local;
  
  local_40[0] = '\x01';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  ptr._4_4_ = 0xffffffde;
  tag = (u_char *)0x0;
  memset(local_78,0,0x20);
  tag = one;
  _libssh2_store_u64(&tag,(ulong)seqnr);
  chacha_ivsetup(&ctx->main_ctx,one,(u8 *)0x0);
  chacha_encrypt_bytes(&ctx->main_ctx,local_78,local_78,0x20);
  if (do_encrypt == 0) {
    poly1305_auth(poly_key + 0x18,src,(ulong)(aadlen + len),local_78);
    iVar1 = chachapoly_timingsafe_bcmp(poly_key + 0x18,src + (ulong)len + (ulong)aadlen,0x10);
    if (iVar1 != 0) {
      ptr._4_4_ = -0xc;
      goto LAB_00110e54;
    }
  }
  if (aadlen != 0) {
    chacha_ivsetup(&ctx->header_ctx,one,(u8 *)0x0);
    chacha_encrypt_bytes(&ctx->header_ctx,src,dest,aadlen);
  }
  chacha_ivsetup(&ctx->main_ctx,one,local_40);
  chacha_encrypt_bytes(&ctx->main_ctx,src + aadlen,dest + aadlen,len);
  if (do_encrypt != 0) {
    poly1305_auth(dest + (ulong)len + (ulong)aadlen,dest,(ulong)(aadlen + len),local_78);
  }
  ptr._4_4_ = 0;
LAB_00110e54:
  memset(poly_key + 0x18,0,0x10);
  memset(one,0,8);
  memset(local_78,0,0x20);
  return ptr._4_4_;
}

Assistant:

int
chachapoly_crypt(struct chachapoly_ctx *ctx, u_int seqnr, u_char *dest,
                 const u_char *src, u_int len, u_int aadlen, int do_encrypt)
{
    u_char seqbuf[8];
    const u_char one[8] = { 1, 0, 0, 0, 0, 0, 0, 0 }; /* NB little-endian */
    u_char expected_tag[POLY1305_TAGLEN], poly_key[POLY1305_KEYLEN];
    int r = LIBSSH2_ERROR_INVAL;
    unsigned char *ptr = NULL;

    /*
     * Run ChaCha20 once to generate the Poly1305 key. The IV is the
     * packet sequence number.
     */
    memset(poly_key, 0, sizeof(poly_key));
    ptr = &seqbuf[0];
    _libssh2_store_u64(&ptr, seqnr);
    chacha_ivsetup(&ctx->main_ctx, seqbuf, NULL);
    chacha_encrypt_bytes(&ctx->main_ctx,
                         poly_key, poly_key, sizeof(poly_key));

    /* If decrypting, check tag before anything else */
    if(!do_encrypt) {
        const u_char *tag = src + aadlen + len;

        poly1305_auth(expected_tag, src, aadlen + len, poly_key);
        if(chachapoly_timingsafe_bcmp(expected_tag, tag, POLY1305_TAGLEN)
           != 0) {
            r = LIBSSH2_ERROR_DECRYPT;
            goto out;
        }
    }

    /* Crypt additional data */
    if(aadlen) {
        chacha_ivsetup(&ctx->header_ctx, seqbuf, NULL);
        chacha_encrypt_bytes(&ctx->header_ctx, src, dest, aadlen);
    }

    /* Set Chacha's block counter to 1 */
    chacha_ivsetup(&ctx->main_ctx, seqbuf, one);
    chacha_encrypt_bytes(&ctx->main_ctx, src + aadlen,
                         dest + aadlen, len);

    /* If encrypting, calculate and append tag */
    if(do_encrypt) {
        poly1305_auth(dest + aadlen + len, dest, aadlen + len,
                      poly_key);
    }
    r = 0;
out:
    memset(expected_tag, 0, sizeof(expected_tag));
    memset(seqbuf, 0, sizeof(seqbuf));
    memset(poly_key, 0, sizeof(poly_key));
    return r;
}